

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

void __thiscall maths::Matrix::clear(Matrix *this)

{
  int j;
  int i;
  Matrix *this_local;
  
  for (i = 0; i < this->rows_; i = i + 1) {
    for (j = 0; j < this->cols_; j = j + 1) {
      this->p[i][j] = 0.0;
    }
  }
  return;
}

Assistant:

void Matrix::clear()
{
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            p[i][j] = 0;
        }
    }
}